

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

mpack_tag_t mpack_node_tag(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_tag_t mVar2;
  mpack_tag_t mVar3;
  mpack_node_t node_local;
  mpack_tag_t tag;
  
  mVar1 = mpack_node_error(node);
  if (mVar1 != mpack_ok) {
    mVar2 = mpack_tag_nil();
    mVar3._12_4_ = 0;
    mVar3.v = (anon_union_8_8_6320e492_for_v)SUB128(mVar2._0_12_,0);
    mVar3.type = SUB124(mVar2._0_12_,8);
    return mVar3;
  }
  mVar2 = (mpack_tag_t)
          (*(code *)(&DAT_00114dac +
                    *(int *)(&DAT_00114dac + (ulong)((node.data)->type - mpack_type_nil) * 4)))();
  return mVar2;
}

Assistant:

mpack_tag_t mpack_node_tag(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return mpack_tag_nil();

    mpack_tag_t tag = MPACK_TAG_ZERO;

    tag.type = node.data->type;
    switch (node.data->type) {
        case mpack_type_nil:                                            break;
        case mpack_type_bool:    tag.v.b = node.data->value.b;          break;
        case mpack_type_float:   tag.v.f = node.data->value.f;          break;
        case mpack_type_double:  tag.v.d = node.data->value.d;          break;
        case mpack_type_int:     tag.v.i = node.data->value.i;          break;
        case mpack_type_uint:    tag.v.u = node.data->value.u;          break;

        case mpack_type_str:     tag.v.l = node.data->len;     break;
        case mpack_type_bin:     tag.v.l = node.data->len;     break;

        case mpack_type_ext:
            tag.v.ext.length = node.data->len;
            tag.v.ext.exttype = mpack_node_exttype_unchecked(node);
            break;

        case mpack_type_array:   tag.v.n = node.data->len;  break;
        case mpack_type_map:     tag.v.n = node.data->len;  break;

        default:
            mpack_assert(0, "unrecognized type %i", (int)node.data->type);
            break;
    }
    return tag;
}